

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O2

string * __thiscall
Datetime::monthName_abi_cxx11_(string *__return_storage_ptr__,Datetime *this,int month)

{
  if ((int)(uint)this < 1) {
    __assert_fail("month > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GothenburgBitFactory[P]flod/src/libshared/src/Datetime.cpp"
                  ,0xd6a,"static std::string Datetime::monthName(int)");
  }
  if ((uint)this < 0xd) {
    upperCaseFirst(__return_storage_ptr__,
                   monthNames_abi_cxx11_.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + (((ulong)this & 0xffffffff) - 1));
    return __return_storage_ptr__;
  }
  __assert_fail("month <= 12",
                "/workspace/llm4binary/github/license_all_cmakelists_25/GothenburgBitFactory[P]flod/src/libshared/src/Datetime.cpp"
                ,0xd6b,"static std::string Datetime::monthName(int)");
}

Assistant:

std::string Datetime::monthName (int month)
{
  assert (month > 0);
  assert (month <= 12);
  return upperCaseFirst (monthNames[month - 1]);
}